

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQVM::Mark(SQVM *this,SQCollectable **chain)

{
  SQObjectPtr *pSVar1;
  SQCollectable_conflict **in_RSI;
  SQCollectable_conflict *in_RDI;
  SQInteger k;
  SQUnsignedInteger i;
  SQCollectable_conflict **in_stack_ffffffffffffffc8;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  byte *o;
  long local_20;
  byte *local_18;
  
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    (in_RDI->super_SQRefCounted)._uiRef = (in_RDI->super_SQRefCounted)._uiRef | 0x80000000;
    SQSharedState::MarkObject(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    SQSharedState::MarkObject(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    SQSharedState::MarkObject(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    SQSharedState::MarkObject(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    SQSharedState::MarkObject(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_18 = (byte *)0x0;
    while( true ) {
      o = local_18;
      pSVar1 = (SQObjectPtr *)sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 1));
      if (pSVar1 <= o) break;
      sqvector<SQObjectPtr>::operator[]
                ((sqvector<SQObjectPtr> *)(in_RDI + 1),(SQUnsignedInteger)local_18);
      SQSharedState::MarkObject((SQObjectPtr *)o,in_stack_ffffffffffffffc8);
      local_18 = local_18 + 1;
    }
    for (local_20 = 0; local_20 < (long)in_RDI[4].super_SQRefCounted._uiRef; local_20 = local_20 + 1
        ) {
      SQSharedState::MarkObject((SQObjectPtr *)o,in_stack_ffffffffffffffc8);
    }
    SQCollectable::RemoveFromChain(&(in_RDI[5]._sharedstate)->_gc_chain,in_RDI);
    SQCollectable::AddToChain(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void SQVM::Mark(SQCollectable **chain)
{
    START_MARK()
        SQSharedState::MarkObject(_lasterror,chain);
        SQSharedState::MarkObject(_errorhandler,chain);
        SQSharedState::MarkObject(_debughook_closure,chain);
        SQSharedState::MarkObject(_roottable, chain);
        SQSharedState::MarkObject(temp_reg, chain);
        for(SQUnsignedInteger i = 0; i < _stack.size(); i++) SQSharedState::MarkObject(_stack[i], chain);
        for(SQInteger k = 0; k < _callsstacksize; k++) SQSharedState::MarkObject(_callsstack[k]._closure, chain);
    END_MARK()
}